

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::AppendProperty(cmTarget *this,string *prop,char *value,bool asString)

{
  TargetType tgtType;
  cmMakefile *pcVar1;
  bool bVar2;
  cmMessenger *messenger;
  ostream *poVar3;
  char *value_local;
  string local_1c8;
  ostringstream e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0 [46];
  
  tgtType = this->TargetTypeValue;
  value_local = value;
  messenger = cmMakefile::GetMessenger(this->Makefile);
  cmMakefile::GetBacktrace((cmMakefile *)&e);
  bVar2 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,prop,messenger,(cmListFileBacktrace *)&e);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1a0);
  if (!bVar2) {
    return;
  }
  bVar2 = std::operator==(prop,"NAME");
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::operator<<((ostream *)&e,"NAME property is read-only\n");
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
  }
  else {
    bVar2 = std::operator==(prop,"EXPORT_NAME");
    if ((bVar2) && (this->IsImportedTarget == true)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               "EXPORT_NAME property can\'t be set on imported targets (\"");
      poVar3 = std::operator<<(poVar3,(string *)&this->Name);
      std::operator<<(poVar3,"\")\n");
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
    }
    else {
      bVar2 = std::operator==(prop,"SOURCES");
      if ((bVar2) && (this->IsImportedTarget == true)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar3 = std::operator<<((ostream *)&e,
                                 "SOURCES property can\'t be set on imported targets (\"");
        poVar3 = std::operator<<(poVar3,(string *)&this->Name);
        std::operator<<(poVar3,"\")\n");
        pcVar1 = this->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
      }
      else {
        bVar2 = std::operator==(prop,"IMPORTED_GLOBAL");
        if (!bVar2) {
          bVar2 = std::operator==(prop,"INCLUDE_DIRECTORIES");
          if (bVar2) {
            if (value_local == (char *)0x0) {
              return;
            }
            if (*value_local == '\0') {
              return;
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       (this->Internal).Pointer,&value_local);
            cmMakefile::GetBacktrace((cmMakefile *)&e);
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                      (&((this->Internal).Pointer)->IncludeDirectoriesBacktraces,(value_type *)&e);
          }
          else {
            bVar2 = std::operator==(prop,"COMPILE_OPTIONS");
            if (bVar2) {
              if (value_local == (char *)0x0) {
                return;
              }
              if (*value_local == '\0') {
                return;
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const*&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &((this->Internal).Pointer)->CompileOptionsEntries,&value_local);
              cmMakefile::GetBacktrace((cmMakefile *)&e);
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                        (&((this->Internal).Pointer)->CompileOptionsBacktraces,(value_type *)&e);
            }
            else {
              bVar2 = std::operator==(prop,"COMPILE_FEATURES");
              if (bVar2) {
                if (value_local == (char *)0x0) {
                  return;
                }
                if (*value_local == '\0') {
                  return;
                }
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const*&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &((this->Internal).Pointer)->CompileFeaturesEntries,&value_local);
                cmMakefile::GetBacktrace((cmMakefile *)&e);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&((this->Internal).Pointer)->CompileFeaturesBacktraces,(value_type *)&e);
              }
              else {
                bVar2 = std::operator==(prop,"COMPILE_DEFINITIONS");
                if (bVar2) {
                  if (value_local == (char *)0x0) {
                    return;
                  }
                  if (*value_local == '\0') {
                    return;
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const*&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &((this->Internal).Pointer)->CompileDefinitionsEntries,&value_local);
                  cmMakefile::GetBacktrace((cmMakefile *)&e);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&((this->Internal).Pointer)->CompileDefinitionsBacktraces,
                             (value_type *)&e);
                }
                else {
                  bVar2 = std::operator==(prop,"LINK_OPTIONS");
                  if (bVar2) {
                    if (value_local == (char *)0x0) {
                      return;
                    }
                    if (*value_local == '\0') {
                      return;
                    }
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const*&>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &((this->Internal).Pointer)->LinkOptionsEntries,&value_local);
                    cmMakefile::GetBacktrace((cmMakefile *)&e);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&((this->Internal).Pointer)->LinkOptionsBacktraces,(value_type *)&e);
                  }
                  else {
                    bVar2 = std::operator==(prop,"LINK_DIRECTORIES");
                    if (bVar2) {
                      if (value_local == (char *)0x0) {
                        return;
                      }
                      if (*value_local == '\0') {
                        return;
                      }
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<char_const*&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&((this->Internal).Pointer)->LinkDirectoriesEntries,&value_local
                                );
                      cmMakefile::GetBacktrace((cmMakefile *)&e);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&((this->Internal).Pointer)->LinkDirectoriesBacktraces,
                                (value_type *)&e);
                    }
                    else {
                      bVar2 = std::operator==(prop,"LINK_LIBRARIES");
                      if (bVar2) {
                        if (value_local == (char *)0x0) {
                          return;
                        }
                        if (*value_local == '\0') {
                          return;
                        }
                        cmMakefile::GetBacktrace((cmMakefile *)&e);
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&((this->Internal).Pointer)->LinkImplementationPropertyEntries
                                   ,&value_local);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&((this->Internal).Pointer)->LinkImplementationPropertyBacktraces,
                                  (value_type *)&e);
                      }
                      else {
                        bVar2 = std::operator==(prop,"SOURCES");
                        if (!bVar2) {
                          bVar2 = cmHasLiteralPrefix<std::__cxx11::string,17ul>
                                            (prop,(char (*) [17])"IMPORTED_LIBNAME");
                          if (bVar2) {
                            pcVar1 = this->Makefile;
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&e,prop," property may not be APPENDed.");
                            cmMakefile::IssueMessage
                                      (pcVar1,FATAL_ERROR,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&e);
                            std::__cxx11::string::~string((string *)&e);
                            return;
                          }
                          cmPropertyMap::AppendProperty(&this->Properties,prop,value_local,asString)
                          ;
                          return;
                        }
                        cmMakefile::GetBacktrace((cmMakefile *)&e);
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&((this->Internal).Pointer)->SourceEntries,&value_local);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&((this->Internal).Pointer)->SourceBacktraces,(value_type *)&e);
                      }
                    }
                  }
                }
              }
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1a0);
          return;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar3 = std::operator<<((ostream *)&e,
                                 "IMPORTED_GLOBAL property can\'t be appended, only set on imported targets (\""
                                );
        poVar3 = std::operator<<(poVar3,(string *)&this->Name);
        std::operator<<(poVar3,"\")\n");
        pcVar1 = this->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop, const char* value,
                              bool asString)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->Makefile->GetBacktrace())) {
    return;
  }
  if (prop == "NAME") {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "EXPORT_NAME" && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "SOURCES" && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << this->Name
      << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "IMPORTED_GLOBAL") {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be appended, only set on imported "
         "targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    if (value && *value) {
      this->Internal->IncludeDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_OPTIONS") {
    if (value && *value) {
      this->Internal->CompileOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_FEATURES") {
    if (value && *value) {
      this->Internal->CompileFeaturesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_DEFINITIONS") {
    if (value && *value) {
      this->Internal->CompileDefinitionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_OPTIONS") {
    if (value && *value) {
      this->Internal->LinkOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_DIRECTORIES") {
    if (value && *value) {
      this->Internal->LinkDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_LIBRARIES") {
    if (value && *value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.emplace_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == "SOURCES") {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.emplace_back(value);
    this->Internal->SourceBacktraces.push_back(lfbt);
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME")) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 prop + " property may not be APPENDed.");
  } else {
    this->Properties.AppendProperty(prop, value, asString);
  }
}